

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

cmFileList * __thiscall cmFileList::operator/(cmFileList *this,cmFileListGeneratorBase *rhs)

{
  cmFileListGeneratorBase *pcVar1;
  auto_ptr<cmFileListGeneratorBase> local_28;
  cmFileListGeneratorBase *local_20;
  cmFileListGeneratorBase *local_18;
  cmFileListGeneratorBase *rhs_local;
  cmFileList *this_local;
  
  local_18 = rhs;
  rhs_local = (cmFileListGeneratorBase *)this;
  if (this->Last == (cmFileListGeneratorBase *)0x0) {
    (*rhs->_vptr_cmFileListGeneratorBase[3])(&local_28);
    local_20 = (cmFileListGeneratorBase *)
               ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_28);
    ::cm::auto_ptr<cmFileListGeneratorBase>::operator=
              (&this->First,(auto_ptr_ref<cmFileListGeneratorBase>)local_20);
    ::cm::auto_ptr<cmFileListGeneratorBase>::~auto_ptr(&local_28);
    pcVar1 = ::cm::auto_ptr<cmFileListGeneratorBase>::get(&this->First);
    this->Last = pcVar1;
  }
  else {
    pcVar1 = cmFileListGeneratorBase::SetNext(this->Last,rhs);
    this->Last = pcVar1;
  }
  return this;
}

Assistant:

cmFileList& operator/(cmFileListGeneratorBase const& rhs)
  {
    if (this->Last) {
      this->Last = this->Last->SetNext(rhs);
    } else {
      this->First = rhs.Clone();
      this->Last = this->First.get();
    }
    return *this;
  }